

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecker.c
# Opt level: O2

int raviX_ast_typecheck(CompilerState *compiler_state)

{
  AstNode *pAVar1;
  int iVar2;
  AstNodeList *list;
  
  pAVar1 = compiler_state->main_function;
  (compiler_state->error_message).pos = 0;
  iVar2 = _setjmp((__jmp_buf_tag *)compiler_state->env);
  if (iVar2 == 0) {
    typecheck_ast_list(compiler_state,
                       (AstNode *)(pAVar1->field_2).function_expr.function_statement_list,list);
  }
  return iVar2;
}

Assistant:

int raviX_ast_typecheck(CompilerState *compiler_state)
{
	AstNode *main_function = compiler_state->main_function;
	raviX_buffer_reset(&compiler_state->error_message);
	int rc = setjmp(compiler_state->env);
	if (rc == 0) {
		typecheck_function(compiler_state, main_function);
	}
	return rc;
}